

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O0

void __thiscall
miyuki::serialize::InputArchive::_load_nvp<std::shared_ptr<Bar>>
          (InputArchive *this,char *name,shared_ptr<Bar> *value)

{
  bool bVar1;
  json *pjVar2;
  const_reference ref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  allocator<char> local_41;
  string local_40 [32];
  shared_ptr<Bar> *local_20;
  shared_ptr<Bar> *value_local;
  char *name_local;
  InputArchive *this_local;
  
  local_20 = value;
  value_local = (shared_ptr<Bar> *)name;
  name_local = (char *)this;
  pjVar2 = _top_abi_cxx11_(this);
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_*&,_0>(pjVar2,(char **)&value_local);
  if (bVar1) {
    pjVar2 = _top_abi_cxx11_(this);
    ref = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::operator[]<char_const>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)pjVar2,(char *)value_local);
    _makeNode(this,ref);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"/",&local_41);
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::append((char *)local_40);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,__args);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    _load<Bar>(this,local_20);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
    _popNode(this);
  }
  return;
}

Assistant:

void _load_nvp(const char *name, T &value) {
            if (_top().contains(name)) {
                _makeNode(_top()[name]);
                locator.emplace_back(std::string("/").append(name));
                _load(value);
                locator.pop_back();
                _popNode();
            }
        }